

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

void __thiscall QSlider::initStyleOption(QSlider *this,QStyleOptionSlider *option)

{
  long lVar1;
  QSliderPrivate *widget;
  QStyleOption *in_RSI;
  long in_FS_OFFSET;
  byte bVar2;
  QSliderPrivate *d;
  SubControl in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QStyleOption *)0x0) {
    widget = d_func((QSlider *)0x682651);
    QStyleOption::initFrom(in_RSI,(QWidget *)widget);
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    in_RSI[1].version = local_c;
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    in_RSI[1].type = local_10;
    in_RSI[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = (widget->super_QAbstractSliderPrivate).orientation;
    in_RSI[1].rect.x1.m_i = (widget->super_QAbstractSliderPrivate).maximum;
    in_RSI[1].direction =
         *(LayoutDirection *)
          &(widget->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254;
    in_RSI[1].rect.y1.m_i = widget->tickPosition;
    in_RSI[1].rect.x2.m_i = widget->tickInterval;
    if ((widget->super_QAbstractSliderPrivate).orientation == Horizontal) {
      bVar2 = (bool)((byte)(widget->super_QAbstractSliderPrivate).field_0x27c >> 3 & 1) !=
              (in_RSI->direction == RightToLeft);
    }
    else {
      bVar2 = ((byte)(widget->super_QAbstractSliderPrivate).field_0x27c >> 3 & 1) != 0 ^ 0xff;
    }
    *(byte *)&in_RSI[1].rect.y2.m_i = bVar2 & 1;
    in_RSI->direction = LeftToRight;
    *(int *)&in_RSI[1].fontMetrics = (widget->super_QAbstractSliderPrivate).position;
    *(int *)&in_RSI[1].field_0x24 = (widget->super_QAbstractSliderPrivate).value;
    *(int *)&in_RSI[1].palette.d = (widget->super_QAbstractSliderPrivate).singleStep;
    *(int *)((long)&in_RSI[1].palette.d + 4) = (widget->super_QAbstractSliderPrivate).pageStep;
    if ((widget->super_QAbstractSliderPrivate).orientation == Horizontal) {
      QFlags<QStyle::StateFlag>::operator|=(&in_RSI->state,State_Horizontal);
    }
    if (widget->pressedControl == SC_None) {
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      in_RSI[1].type = local_18;
    }
    else {
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      in_RSI[1].type = local_14;
      QFlags<QStyle::StateFlag>::operator|=(&in_RSI->state,State_Sunken);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSlider::initStyleOption(QStyleOptionSlider *option) const
{
    if (!option)
        return;

    Q_D(const QSlider);
    option->initFrom(this);
    option->subControls = QStyle::SC_None;
    option->activeSubControls = QStyle::SC_None;
    option->orientation = d->orientation;
    option->maximum = d->maximum;
    option->minimum = d->minimum;
    option->tickPosition = (QSlider::TickPosition)d->tickPosition;
    option->tickInterval = d->tickInterval;
    option->upsideDown = (d->orientation == Qt::Horizontal) ?
                     (d->invertedAppearance != (option->direction == Qt::RightToLeft))
                     : (!d->invertedAppearance);
    option->direction = Qt::LeftToRight; // we use the upsideDown option instead
    option->sliderPosition = d->position;
    option->sliderValue = d->value;
    option->singleStep = d->singleStep;
    option->pageStep = d->pageStep;
    if (d->orientation == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;

    if (d->pressedControl) {
        option->activeSubControls = d->pressedControl;
        option->state |= QStyle::State_Sunken;
    } else {
        option->activeSubControls = d->hoverControl;
    }
}